

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::FindFile
                   (string *__return_storage_ptr__,string *name,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *userPaths,bool no_system_path)

{
  bool bVar1;
  string tryPath;
  allocator local_31;
  string local_30;
  
  FindName(&local_30,name,userPaths,no_system_path);
  if (local_30._M_string_length != 0) {
    bVar1 = FileIsDirectory(&local_30);
    if (!bVar1) {
      CollapseFullPath(__return_storage_ptr__,&local_30);
      goto LAB_004631c3;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
LAB_004631c3:
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools
::FindFile(const kwsys_stl::string& name,
           const kwsys_stl::vector<kwsys_stl::string>& userPaths,
           bool no_system_path)
{
  kwsys_stl::string tryPath = SystemTools::FindName(name, userPaths, no_system_path);
  if(!tryPath.empty() && !SystemTools::FileIsDirectory(tryPath))
    {
    return SystemTools::CollapseFullPath(tryPath);
    }
  // Couldn't find the file.
  return "";
}